

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O0

btMatrixX<float> * __thiscall
btMatrixX<float>::operator*(btMatrixX<float> *this,btMatrixX<float> *other)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  btMatrixX<float> *in_RDX;
  btMatrixX<float> *in_RSI;
  btMatrixX<float> *in_RDI;
  float w;
  int v;
  float dotProd;
  int i;
  int j;
  btMatrixX<float> *res;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float fVar4;
  btMatrixX<float> *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  
  rows(in_RSI);
  cols(in_RDX);
  btMatrixX((btMatrixX<float> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
            (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
  setZero(in_stack_ffffffffffffff80);
  for (local_30 = 0; iVar1 = cols(in_RDI), local_30 < iVar1; local_30 = local_30 + 1) {
    local_34 = 0;
    while (iVar1 = local_34, iVar2 = rows(in_RDI), iVar1 < iVar2) {
      local_38 = 0.0;
      local_3c = 0;
      while (iVar1 = local_3c, iVar2 = rows(in_RSI), iVar1 < iVar2) {
        pfVar3 = operator()((btMatrixX<float> *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
        fVar4 = *pfVar3;
        pfVar3 = operator()((btMatrixX<float> *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
        if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
          pfVar3 = operator()((btMatrixX<float> *)CONCAT44(fVar4,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
          local_38 = fVar4 * *pfVar3 + local_38;
          in_stack_ffffffffffffff74 = fVar4;
        }
        local_3c = local_3c + 1;
      }
      if ((local_38 != 0.0) || (NAN(local_38))) {
        setElem((btMatrixX<float> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0.0);
      }
      local_34 = local_34 + 1;
    }
  }
  return in_RDI;
}

Assistant:

btMatrixX operator*(const btMatrixX& other)
	{
		//btMatrixX*btMatrixX implementation, brute force
		btAssert(cols() == other.rows());

		btMatrixX res(rows(),other.cols());
		res.setZero();
//		BT_PROFILE("btMatrixX mul");
		for (int j=0; j < res.cols(); ++j)
		{
			{
				for (int i=0; i < res.rows(); ++i)
				{
					T dotProd=0;
//					T dotProd2=0;
					//int waste=0,waste2=0;

					{
//						bool useOtherCol = true;
						{
							for (int v=0;v<rows();v++)
							{
								T w = (*this)(i,v);
								if (other(v,j)!=0.f)
								{
									dotProd+=w*other(v,j);	
								}
						
							}
						}
					}
					if (dotProd)
						res.setElem(i,j,dotProd);
				}
			}
		}
		return res;
	}